

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_horde_communion(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  RString *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char_data *in_stack_ffffffffffffff80;
  ushort in_stack_ffffffffffffff88;
  undefined2 uVar3;
  short sVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffff96;
  CHAR_DATA *local_10;
  
  bVar1 = is_npc(in_stack_ffffffffffffff68);
  if ((!bVar1) ||
     ((in_RDX->desc != (DESCRIPTOR_DATA *)0x0 && (in_RDX->desc->original != (CHAR_DATA *)0x0)))) {
    bVar1 = is_npc(in_stack_ffffffffffffff68);
    local_10 = in_RDX;
    if (bVar1) {
      local_10 = in_RDX->desc->original;
    }
    bVar1 = is_affected(in_RCX,(int)gsn_horde_communion);
    if (bVar1) {
      send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (local_10 == in_RCX) {
      send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (((local_10->cabal == 3) && (local_10->pcdata->induct == 5)) ||
            (bVar1 = is_immortal(in_stack_ffffffffffffff68), bVar1)) {
      bVar1 = is_npc(in_stack_ffffffffffffff68);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else if (in_RCX->cabal == 3) {
        send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else if (in_RCX->cabal == 0) {
        if ((0xe < in_RCX->level) && (bVar1 = is_lawful(in_stack_ffffffffffffff68), !bVar1)) {
          char_data::Class(in_stack_ffffffffffffff80);
          bVar1 = RString::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
          if (!bVar1) {
            char_data::Class(in_stack_ffffffffffffff80);
            bVar1 = RString::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68)
            ;
            if (!bVar1) {
              char_data::Class(in_stack_ffffffffffffff80);
              bVar1 = RString::operator==(in_stack_ffffffffffffff70,
                                          (char *)in_stack_ffffffffffffff68);
              if (!bVar1) {
                char_data::Class(in_stack_ffffffffffffff80);
                bVar1 = RString::operator==(in_stack_ffffffffffffff70,
                                            (char *)in_stack_ffffffffffffff68);
                if (!bVar1) {
                  char_data::Class(in_stack_ffffffffffffff80);
                  bVar1 = RString::operator==(in_stack_ffffffffffffff70,
                                              (char *)in_stack_ffffffffffffff68);
                  if (!bVar1) {
                    char_data::Class(in_stack_ffffffffffffff80);
                    bVar1 = RString::operator==(in_stack_ffffffffffffff70,
                                                (char *)in_stack_ffffffffffffff68);
                    if (!bVar1) {
                      if ((cabal_max[3] <= cabal_members[3]) &&
                         (iVar2 = get_trust(in_stack_ffffffffffffff68), iVar2 < 0x36)) {
                        send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
                        return;
                      }
                      act((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
                      act((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
                      act((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
                      init_affect((AFFECT_DATA *)0x6536c0);
                      uVar3 = 0;
                      uVar5 = 0;
                      uVar6 = 0;
                      sVar4 = gsn_horde_communion;
                      new_affect_to_char((CHAR_DATA *)CONCAT26(in_stack_ffffffffffffff96,0xffff),
                                         (AFFECT_DATA *)
                                         CONCAT26(in_SI,CONCAT24(gsn_horde_communion,
                                                                 (uint)in_stack_ffffffffffffff88)));
                      new_affect_to_char((CHAR_DATA *)
                                         CONCAT26(in_stack_ffffffffffffff96,
                                                  CONCAT24(uVar6,CONCAT22(uVar5,0x18))),
                                         (AFFECT_DATA *)
                                         CONCAT26(in_SI,CONCAT24(sVar4,CONCAT22(uVar3,
                                                  in_stack_ffffffffffffff88))));
                      return;
                    }
                  }
                }
              }
            }
          }
        }
        act((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            in_stack_ffffffffffffff68,0);
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void spell_horde_communion(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_npc(ch) && (!ch->desc || !ch->desc->original))
		return;

	if (is_npc(ch))
		ch = ch->desc->original;

	if (is_affected(victim, gsn_horde_communion))
	{
		return send_to_char("They cannot try the communion ritual again right now.\n\r", ch);
	}

	if (ch == victim)
	{
		send_to_char("You have already undergone the sacred communion!\n\r", ch);
		return;
	}

	if ((ch->cabal != CABAL_HORDE || ch->pcdata->induct != CABAL_LEADER) && !is_immortal(ch))
	{
		send_to_char("It is not your place to call upon the spirits thus!\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You profane the spirits with such notions.\n\r", ch);
		return;
	}

	if (victim->cabal == CABAL_HORDE)
	{
		send_to_char("The spirits will only answer the call once in each person's lifetime.\n\r", ch);
		return;
	}

	if (victim->cabal != CABAL_NONE)
	{
		send_to_char("That one has other allegiances already!", ch);
		return;
	}

	if (victim->level < 15
		|| is_lawful(victim)
		|| victim->Class()->name == "sorcerer"
		|| victim->Class()->name == "paladin"
		|| victim->Class()->name == "necromancer"
		|| victim->Class()->name == "healer"
		|| victim->Class()->name == "shapeshifter"
		|| victim->Class()->name == "chronomancer")
	{
		act("$N is not fit to partake in the rites of communion.", ch, 0, victim, TO_CHAR);
		return;
	}

	if (cabal_table[CABAL_HORDE].max_members > 1
		&& cabal_max[CABAL_HORDE] <= cabal_members[CABAL_HORDE]
		&& get_trust(ch) < 54)
	{
		send_to_char("The Horde is as large as it can possibly be.\n\r", ch);
		return;
	}

	act("You prepare $N for communion with the animal spirits of Horde.", ch, 0, victim, TO_CHAR);
	act("A tranquil calm washes over you as your skin tingles slightly.", ch, 0, victim, TO_VICT);
	act("A gentle breeze sweeps through, as an eerie silence falls over the area.", ch, 0, victim, TO_NOTVICT);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = gsn_horde_communion;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;
	af.owner = ch;
	af.level = level;
	af.tick_fun = communion_tick;
	new_affect_to_char(victim, &af);

	af.duration = 24;
	af.tick_fun = nullptr;
	new_affect_to_char(ch, &af);
}